

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

DBErrors __thiscall wallet::CWallet::ReorderTransactions(CWallet *this)

{
  int64_t *__args;
  _Rb_tree_header *p_Var1;
  WalletDatabase *pWVar2;
  CWalletTx *wtx;
  bool bVar3;
  long lVar4;
  _Base_ptr p_Var5;
  long lVar6;
  DBErrors DVar7;
  vector<long,_std::allocator<long>_> *__range3;
  int64_t *nOffsetStart;
  int64_t nOrderPosNext;
  long *plVar8;
  _Hash_node_base *p_Var9;
  long in_FS_OFFSET;
  vector<long,_std::allocator<long>_> nOrderPosOffsets;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  TxItems txByTime;
  pair<unsigned_int,_wallet::CWalletTx_*> local_a8;
  long *local_98;
  WalletBatch local_88;
  unique_lock<std::recursive_mutex> local_78;
  _Rb_tree<long,_std::pair<const_long,_wallet::CWalletTx_*>,_std::_Select1st<std::pair<const_long,_wallet::CWalletTx_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  pWVar2 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar2 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_88,pWVar2,1);
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var9 = (this->mapWallet)._M_h._M_before_begin._M_nxt;
  local_88.m_database = pWVar2;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (p_Var9 == (_Hash_node_base *)0x0) {
    nOrderPosNext = 0;
    this->nOrderPosNext = 0;
    local_98 = (long *)0x0;
    local_a8._0_8_ = (long *)0x0;
    local_a8.second = (CWalletTx *)0x0;
  }
  else {
    do {
      local_a8.second = (CWalletTx *)(p_Var9 + 5);
      local_a8.first = *(uint *)((long)&p_Var9[0xe]._M_nxt + 4);
      std::
      _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
      ::_M_emplace_equal<std::pair<unsigned_int,wallet::CWalletTx*>>
                ((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                  *)&local_68,&local_a8);
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
    nOrderPosNext = 0;
    this->nOrderPosNext = 0;
    local_98 = (long *)0x0;
    local_a8._0_8_ = (long *)0x0;
    local_a8.second = (CWalletTx *)0x0;
    if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var5 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        wtx = (CWalletTx *)p_Var5[1]._M_parent;
        __args = &wtx->nOrderPos;
        lVar4 = wtx->nOrderPos;
        if (lVar4 == -1) {
          lVar4 = this->nOrderPosNext;
          this->nOrderPosNext = lVar4 + 1;
          *__args = lVar4;
          if (local_a8.second == (CWalletTx *)local_98) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_a8,(iterator)local_a8.second,
                       __args);
          }
          else {
            *(long *)local_a8.second = lVar4;
            local_a8.second = (CWalletTx *)((long)local_a8.second + 8);
          }
          bVar3 = WalletBatch::WriteTx(&local_88,wtx);
LAB_0052a12d:
          if (bVar3 == false) {
            DVar7 = LOAD_FAIL;
            goto LAB_0052a173;
          }
        }
        else {
          lVar6 = 0;
          for (plVar8 = (long *)local_a8._0_8_; (CWalletTx *)plVar8 != local_a8.second;
              plVar8 = plVar8 + 1) {
            lVar6 = lVar6 + (ulong)(*plVar8 <= lVar4);
          }
          *__args = lVar6 + lVar4;
          lVar4 = lVar4 + lVar6 + 1;
          if (lVar4 < this->nOrderPosNext) {
            lVar4 = this->nOrderPosNext;
          }
          this->nOrderPosNext = lVar4;
          if (lVar6 != 0) {
            bVar3 = WalletBatch::WriteTx(&local_88,wtx);
            goto LAB_0052a12d;
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      nOrderPosNext = this->nOrderPosNext;
    }
  }
  DVar7 = LOAD_OK;
  WalletBatch::WriteOrderPosNext(&local_88,nOrderPosNext);
LAB_0052a173:
  if ((long *)local_a8._0_8_ != (long *)0x0) {
    operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_wallet::CWalletTx_*>,_std::_Select1st<std::pair<const_long,_wallet::CWalletTx_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
  ::~_Rb_tree(&local_68);
  if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
      local_88.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl != (DatabaseBatch *)0x0) {
    (*(*(_func_int ***)
        local_88.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return DVar7;
  }
  __stack_chk_fail();
}

Assistant:

DBErrors CWallet::ReorderTransactions()
{
    LOCK(cs_wallet);
    WalletBatch batch(GetDatabase());

    // Old wallets didn't have any defined order for transactions
    // Probably a bad idea to change the output of this

    // First: get all CWalletTx into a sorted-by-time multimap.
    typedef std::multimap<int64_t, CWalletTx*> TxItems;
    TxItems txByTime;

    for (auto& entry : mapWallet)
    {
        CWalletTx* wtx = &entry.second;
        txByTime.insert(std::make_pair(wtx->nTimeReceived, wtx));
    }

    nOrderPosNext = 0;
    std::vector<int64_t> nOrderPosOffsets;
    for (TxItems::iterator it = txByTime.begin(); it != txByTime.end(); ++it)
    {
        CWalletTx *const pwtx = (*it).second;
        int64_t& nOrderPos = pwtx->nOrderPos;

        if (nOrderPos == -1)
        {
            nOrderPos = nOrderPosNext++;
            nOrderPosOffsets.push_back(nOrderPos);

            if (!batch.WriteTx(*pwtx))
                return DBErrors::LOAD_FAIL;
        }
        else
        {
            int64_t nOrderPosOff = 0;
            for (const int64_t& nOffsetStart : nOrderPosOffsets)
            {
                if (nOrderPos >= nOffsetStart)
                    ++nOrderPosOff;
            }
            nOrderPos += nOrderPosOff;
            nOrderPosNext = std::max(nOrderPosNext, nOrderPos + 1);

            if (!nOrderPosOff)
                continue;

            // Since we're changing the order, write it back
            if (!batch.WriteTx(*pwtx))
                return DBErrors::LOAD_FAIL;
        }
    }
    batch.WriteOrderPosNext(nOrderPosNext);

    return DBErrors::LOAD_OK;
}